

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

Am_Connection * Am_Connection::Open(void)

{
  int iVar1;
  Am_Connection *this;
  Am_Connection_Data *this_00;
  Connection_List_Ptr pcVar2;
  int flag;
  sockaddr_in in_sa;
  undefined4 local_2c;
  sockaddr local_28;
  
  this = (Am_Connection *)operator_new(8);
  Am_Connection(this);
  this_00 = (Am_Connection_Data *)operator_new(0x48);
  Am_Connection_Data::Am_Connection_Data(this_00);
  this->data = this_00;
  pcVar2 = (Connection_List_Ptr)operator_new(0x10);
  pcVar2->connection_ptr = this;
  pcVar2->next = connection_list;
  num_sockets = num_sockets + 1;
  connection_list = pcVar2;
  this_00->waiting = true;
  if (m_parent_socket == 0) {
    local_28.sa_family = 2;
    local_28.sa_data[0] = -0x58;
    local_28.sa_data[1] = '\x16';
    local_28.sa_data[2] = '\0';
    local_28.sa_data[3] = '\0';
    local_28.sa_data[4] = '\0';
    local_28.sa_data[5] = '\0';
    m_parent_socket = socket(2,1,0);
    if (m_parent_socket < 0) {
      perror("socket");
      this->data = (Am_Connection_Data *)0x0;
    }
    else {
      local_2c = 1;
      max_socket = m_parent_socket;
      iVar1 = setsockopt(m_parent_socket,1,2,&local_2c,4);
      if (iVar1 != 0) {
        perror("setsockopt (SO_REUSE_ADDR)");
        this->data = (Am_Connection_Data *)0x0;
      }
      iVar1 = bind(m_parent_socket,&local_28,0x10);
      if (iVar1 < 0) {
        perror("fallback bind");
      }
      iVar1 = listen(m_parent_socket,1);
      if (iVar1 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Listen failed\n",0xe);
      }
    }
  }
  else {
    close(*(int *)&(this_00->super_Am_Wrapper).field_0xc);
  }
  return this;
}

Assistant:

Am_Connection *
Am_Connection::Open(void)
{
  /*
   * Variable initialization
   */
  struct sockaddr_in in_sa; /* Internet socket addr. structure */
  Am_Connection *p_connection;
  p_connection = new Am_Connection;
  p_connection->data = new Am_Connection_Data;

  Add_Connection(p_connection);

  p_connection->Set_Waiting_Flag(true);
  if (m_parent_socket == 0) {
    /* Put host's address and address type into socket structure */
    in_sa.sin_addr.s_addr = INADDR_ANY;
    in_sa.sin_family = PF_INET;
    /* Put the port into the socket structure */
    in_sa.sin_port = Am_SOCKET_PORT;

    if ((m_parent_socket = socket(PF_INET, SOCK_STREAM, 0)) < 0) {
      perror("socket");
      p_connection->Set_Valid_Flag(false);
      // InvalidateAll();
    } else // m_parent_socket valid
    {
      max_socket = m_parent_socket;
      int flag = 1;
      if (setsockopt(m_parent_socket, SOL_SOCKET, SO_REUSEADDR, &flag,
                     sizeof(int))) {
        perror("setsockopt (SO_REUSE_ADDR)");
        p_connection->Set_Valid_Flag(false);
      }
      int count = 0;
      // bind my socket to the specified port
      int error_code = 0;
      if ((error_code = bind(m_parent_socket, (struct sockaddr *)&in_sa,
                             sizeof(in_sa))) < 0) {
        perror("fallback bind");
        count++;
        //p_connection->Set_Valid_Flag(false);
        // Invalidate_All();
      } // need to add check for failure 7/2/97
      //Set the maximum number of connections we
      //will fall behind

      if ((listen(m_parent_socket, BACKLOG)) < 0) {
        std::cerr << "Listen failed\n";
        //p_connection->Set_Valid_Flag(false);
        //Invalidate_All();
      }
    }  //m_parent_socket valid
  }    // If parent socket == 0
  else // Parent Socket initialized
    close(p_connection->Get_Socket());
  return p_connection;
}